

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getJointPos(KinDynComputations *this,Span<double,__1L> q)

{
  long lVar1;
  PointerType pdVar2;
  extent_type<_1L> eVar3;
  MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_1> local_58;
  MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_1> local_40;
  
  eVar3 = q.storage_.super_extent_type<_1L>.size_;
  lVar1 = iDynTree::Model::getNrOfPosCoords();
  if (lVar1 == eVar3.size_) {
    iDynTree::FreeFloatingPos::jointPos();
    pdVar2 = (PointerType)iDynTree::VectorDynSize::data();
    local_40.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = iDynTree::VectorDynSize::size();
    local_58.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = q.storage_.data_;
    local_58.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = eVar3.size_;
    local_40.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = pdVar2;
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>::
    operator=(&local_58,&local_40);
  }
  else {
    iDynTree::reportError("KinDynComputations","getJointPos","Wrong size in input q.");
  }
  return lVar1 == eVar3.size_;
}

Assistant:

bool KinDynComputations::getJointPos(Span<double> q) const
{
    bool ok = q.size() == pimpl->m_robot_model.getNrOfPosCoords();
    if( !ok )
    {
        reportError("KinDynComputations","getJointPos","Wrong size in input q.");
        return false;
    }

    toEigen(q) = toEigen(this->pimpl->m_pos.jointPos());
    return true;
}